

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManSpecBuild(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int fDualOut,
                     int fSpeculate,Vec_Int_t *vTrace,Vec_Int_t *vGuide,Vec_Int_t *vMap)

{
  Gia_Rpr_t GVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint iLit1;
  ulong uVar5;
  
  pGVar2 = p->pObjs;
  if (pObj < pGVar2) {
LAB_001ff20a:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (pGVar2 + p->nObjs <= pObj) goto LAB_001ff20a;
  GVar1 = p->pReprs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
  uVar5 = (ulong)(uint)GVar1 & 0xfffffff;
  if (uVar5 == 0xfffffff) {
    pGVar4 = (Gia_Obj_t *)0x0;
  }
  else {
    if (p->nObjs <= (int)uVar5) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar4 = pGVar2 + uVar5;
  }
  if (pGVar4 == (Gia_Obj_t *)0x0) {
    return;
  }
  if (fDualOut != 0) {
    if ((pGVar4 < pGVar2) || (pGVar2 + p->nObjs <= pGVar4)) goto LAB_001ff20a;
    if (((uint)p->pReprs[(int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * -0x55555555] ^
        (uint)GVar1) < 0x40000000) {
      return;
    }
  }
  if ((int)pGVar4->Value < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  iLit1 = pGVar4->Value ^
          (uint)(((uint)((ulong)*(undefined8 *)((ulong)pGVar4 & 0xfffffffffffffffe) >> 0x3f) ^
                 (uint)pGVar4 & 1) !=
                ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                (uint)pObj & 1));
  if ((((uint)GVar1 >> 0x1c & 1) == 0) && (pObj->Value != iLit1)) {
    if (vTrace != (Vec_Int_t *)0x0) {
      Vec_IntPush(vTrace,1);
    }
    if (vGuide != (Vec_Int_t *)0x0) {
      iVar3 = vTrace->nSize;
      if (((long)iVar3 < 1) || (vGuide->nSize < iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vGuide->pArray[(long)iVar3 + -1] == 0) goto LAB_001ff1f0;
    }
    if (vMap != (Vec_Int_t *)0x0) {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_001ff20a;
      Vec_IntPush(vMap,(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
    }
    iVar3 = Gia_ManHashXor(pNew,pObj->Value,iLit1);
  }
  else {
    if (vTrace == (Vec_Int_t *)0x0) goto LAB_001ff1f0;
    iVar3 = 0;
    vXorLits = vTrace;
  }
  Vec_IntPush(vXorLits,iVar3);
LAB_001ff1f0:
  if (fSpeculate != 0) {
    pObj->Value = iLit1;
  }
  return;
}

Assistant:

static inline void Gia_ManSpecBuild( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int fDualOut, int fSpeculate, Vec_Int_t * vTrace, Vec_Int_t * vGuide, Vec_Int_t * vMap )
{
    Gia_Obj_t * pRepr;
    unsigned iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( pObj->Value != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 1 );
        if ( vGuide == NULL || Vec_IntEntry( vGuide, Vec_IntSize(vTrace)-1 ) )
        {
            if ( vMap )  
                Vec_IntPush( vMap, Gia_ObjId(p, pObj) );
            Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, pObj->Value, iLitNew) );
        }
    }
    else
    {
        if ( vTrace )
            Vec_IntPush( vTrace, 0 );
    }
    if ( fSpeculate )
        pObj->Value = iLitNew;
}